

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_OrderedModifingTransforms_Test::TestBody(TApp_OrderedModifingTransforms_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  Option *pOVar2;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  AssertHelper local_1d8;
  Message local_1d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c4;
  undefined1 local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198 [32];
  iterator local_178;
  size_type local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  iterator local_f0;
  size_type local_e8;
  anon_class_1_0_00000001 local_d9;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_d8;
  anon_class_1_0_00000001 local_b1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  Option *local_30;
  Option *m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  TApp_OrderedModifingTransforms_Test *this_local;
  
  val.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"-m",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  pOVar2 = CLI::App::add_option<std::__cxx11::string>
                     (&(this->super_TApp).app,&local_50,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&m,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pOVar2;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<TApp_OrderedModifingTransforms_Test::TestBody()::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_b0,&local_b1);
  CLI::Option::transform(pOVar2,&local_b0);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_b0);
  pOVar2 = local_30;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<TApp_OrderedModifingTransforms_Test::TestBody()::__1,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_d8,&local_d9);
  CLI::Option::transform(pOVar2,&local_d8);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_d8);
  gtest_ar.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"-mone",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"-mtwo",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  gtest_ar.message_.ptr_._5_1_ = 0;
  local_f0 = &local_130;
  local_e8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
  do {
    local_248 = local_248 + -1;
    std::__cxx11::string::~string((string *)local_248);
  } while (local_248 != &local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_1c3 = 1;
  local_1c0 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"one12",&local_1c1);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"two12",&local_1c2);
  local_1c3 = 0;
  local_178 = &local_1b8;
  local_170 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1c4);
  __l._M_len = local_170;
  __l._M_array = local_178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l,&local_1c4);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_150,"val","std::vector<std::string>({\"one12\", \"two12\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&m,&local_168);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1c4);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_288 = local_288 + -1;
    std::__cxx11::string::~string((string *)local_288);
  } while (local_288 != &local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x52b,message);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&m);
  return;
}

Assistant:

TEST_F(TApp, OrderedModifingTransforms) {
    std::vector<std::string> val;
    auto m = app.add_option("-m", val);
    m->transform([](std::string x) { return x + "1"; });
    m->transform([](std::string x) { return x + "2"; });

    args = {"-mone", "-mtwo"};

    run();

    EXPECT_EQ(val, std::vector<std::string>({"one12", "two12"}));
}